

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.cpp
# Opt level: O2

string * __thiscall
duckdb::Interval::ToString_abi_cxx11_
          (string *__return_storage_ptr__,Interval *this,interval_t *interval)

{
  idx_t iVar1;
  char *in_RCX;
  interval_t interval_00;
  char buffer [70];
  undefined1 auStack_58 [72];
  
  interval_00.micros = (int64_t)auStack_58;
  interval_00._0_8_ = *(undefined8 *)(this + 8);
  iVar1 = IntervalToStringCast::Format(*(IntervalToStringCast **)this,interval_00,in_RCX);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,auStack_58,auStack_58 + iVar1);
  return __return_storage_ptr__;
}

Assistant:

string Interval::ToString(const interval_t &interval) {
	char buffer[70];
	idx_t length = IntervalToStringCast::Format(interval, buffer);
	return string(buffer, length);
}